

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.cpp
# Opt level: O2

int mbedtls_asn1_write_named_bitstring(uchar **p,uchar *start,uchar *buf,size_t bits)

{
  uchar *puVar1;
  int iVar2;
  ulong uVar3;
  byte *pbVar4;
  byte bVar5;
  
  if (bits == 0) {
    iVar2 = mbedtls_asn1_write_bitstring(p,start,buf,0);
    return iVar2;
  }
  pbVar4 = buf + ((bits + 7 >> 3) - 1);
  bVar5 = *pbVar4 >> (((byte)(bits + 7) & 0xf8) - (char)bits & 0x1f);
  while( true ) {
    uVar3 = bits - 1;
    if ((bVar5 & 1) != 0) {
      iVar2 = mbedtls_asn1_write_bitstring(p,start,buf,bits);
      return iVar2;
    }
    if (uVar3 == 0) break;
    bVar5 = bVar5 >> 1;
    bits = uVar3;
    if ((uVar3 & 7) == 0) {
      bVar5 = pbVar4[-1];
      pbVar4 = pbVar4 + -1;
    }
  }
  puVar1 = *p;
  if ((start <= puVar1) && (puVar1 != start)) {
    *p = puVar1 + -1;
    puVar1[-1] = '\0';
    iVar2 = mbedtls_asn1_write_len_and_tag(p,start,1,'\x03');
    return iVar2;
  }
  return -0x6c;
}

Assistant:

int mbedtls_asn1_write_named_bitstring(unsigned char **p,
                                       const unsigned char *start,
                                       const unsigned char *buf,
                                       size_t bits)
{
    size_t unused_bits, byte_len;
    const unsigned char *cur_byte;
    unsigned char cur_byte_shifted;
    unsigned char bit;

    byte_len = (bits + 7) / 8;
    unused_bits = (byte_len * 8) - bits;

    /*
     * Named bitstrings require that trailing 0s are excluded in the encoding
     * of the bitstring. Trailing 0s are considered part of the 'unused' bits
     * when encoding this value in the first content octet
     */
    if (bits != 0) {
        cur_byte = buf + byte_len - 1;
        cur_byte_shifted = *cur_byte >> unused_bits;

        for (;;) {
            bit = cur_byte_shifted & 0x1;
            cur_byte_shifted >>= 1;

            if (bit != 0) {
                break;
            }

            bits--;
            if (bits == 0) {
                break;
            }

            if (bits % 8 == 0) {
                cur_byte_shifted = *--cur_byte;
            }
        }
    }

    return mbedtls_asn1_write_bitstring(p, start, buf, bits);
}